

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oid.c
# Opt level: O2

int mbedtls_oid_get_numeric_string(char *buf,size_t size,mbedtls_asn1_buf *oid)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  size_t __maxlen;
  bool bVar4;
  
  __maxlen = size;
  if (oid->len != 0) {
    uVar1 = snprintf(buf,size,"%d.%d",(ulong)(*oid->p / 0x28),(ulong)(*oid->p % 0x28));
    if ((int)uVar1 < 0) {
      return -0xb;
    }
    uVar3 = (ulong)uVar1;
    if (size < uVar3 || size - uVar3 == 0) {
      return -0xb;
    }
    buf = buf + uVar3;
    __maxlen = size - uVar3;
  }
  uVar3 = 1;
  uVar1 = 0;
  do {
    if (oid->len <= uVar3) {
      return (int)size - (int)__maxlen;
    }
    if (0x1ffffff < uVar1) {
      return -0xb;
    }
    uVar1 = oid->p[uVar3] & 0x7f | uVar1 << 7;
    if (-1 < (char)oid->p[uVar3]) {
      uVar1 = snprintf(buf,__maxlen,".%d");
      if ((int)uVar1 < 0) {
        return -0xb;
      }
      uVar2 = (ulong)uVar1;
      bVar4 = __maxlen < uVar2;
      __maxlen = __maxlen - uVar2;
      if (bVar4 || __maxlen == 0) {
        return -0xb;
      }
      buf = buf + uVar2;
      uVar1 = 0;
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

int mbedtls_oid_get_numeric_string( char *buf, size_t size,
                            const mbedtls_asn1_buf *oid )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i, n;
    unsigned int value;
    char *p;

    p = buf;
    n = size;

    /* First byte contains first two dots */
    if( oid->len > 0 )
    {
        ret = mbedtls_snprintf( p, n, "%d.%d", oid->p[0] / 40, oid->p[0] % 40 );
        OID_SAFE_SNPRINTF;
    }

    value = 0;
    for( i = 1; i < oid->len; i++ )
    {
        /* Prevent overflow in value. */
        if( ( ( value << 7 ) >> 7 ) != value )
            return( MBEDTLS_ERR_OID_BUF_TOO_SMALL );

        value <<= 7;
        value += oid->p[i] & 0x7F;

        if( !( oid->p[i] & 0x80 ) )
        {
            /* Last byte */
            ret = mbedtls_snprintf( p, n, ".%d", value );
            OID_SAFE_SNPRINTF;
            value = 0;
        }
    }

    return( (int) ( size - n ) );
}